

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

uint32_t __thiscall capnp::Schema::getSchemaOffset(Schema *this,Reader *value)

{
  undefined2 uVar1;
  word *pwVar2;
  Reader RVar3;
  Reader RVar4;
  Fault f;
  PointerReader local_28;
  
  if ((value->_reader).dataSize < 0x10) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(value->_reader).data;
  }
  switch(uVar1) {
  case 0xc:
    if ((value->_reader).pointerCount == 0) {
      local_28.nestingLimit = 0x7fffffff;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      local_28.segment = (SegmentReader *)0x0;
    }
    else {
      local_28.segment = (value->_reader).segment;
      local_28.capTable = (value->_reader).capTable;
      local_28.pointer = (value->_reader).pointers;
      local_28.nestingLimit = (value->_reader).nestingLimit;
    }
    RVar4 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_28,(void *)0x0,0);
    pwVar2 = RVar4.super_StringPtr.content.ptr;
    break;
  case 0xd:
    if ((value->_reader).pointerCount == 0) {
      local_28.nestingLimit = 0x7fffffff;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      local_28.segment = (SegmentReader *)0x0;
    }
    else {
      local_28.segment = (value->_reader).segment;
      local_28.capTable = (value->_reader).capTable;
      local_28.pointer = (value->_reader).pointers;
      local_28.nestingLimit = (value->_reader).nestingLimit;
    }
    RVar3 = capnp::_::PointerReader::getBlob<capnp::Data>(&local_28,(void *)0x0,0);
    pwVar2 = (word *)RVar3.super_ArrayPtr<const_unsigned_char>.ptr;
    break;
  case 0xe:
  case 0x10:
  case 0x12:
    if ((value->_reader).pointerCount == 0) {
      local_28.nestingLimit = 0x7fffffff;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      local_28.segment = (SegmentReader *)0x0;
    }
    else {
      local_28.segment = (value->_reader).segment;
      local_28.capTable = (value->_reader).capTable;
      local_28.pointer = (value->_reader).pointers;
      local_28.nestingLimit = (value->_reader).nestingLimit;
    }
    pwVar2 = capnp::_::PointerReader::getUnchecked(&local_28);
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
              ((Fault *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x15e,FAILED,(char *)0x0,
               "\"getDefaultValueSchemaOffset() can only be called on struct, list, \" \"and any-pointer fields.\""
               ,(char (*) [90])
                "getDefaultValueSchemaOffset() can only be called on struct, list, and any-pointer fields."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_28);
  }
  return (uint32_t)((ulong)((long)pwVar2 - (long)this->raw->generic->encodedNode) >> 3);
}

Assistant:

uint32_t Schema::getSchemaOffset(const schema::Value::Reader& value) const {
  const word* ptr;

  switch (value.which()) {
    case schema::Value::TEXT:
      ptr = reinterpret_cast<const word*>(value.getText().begin());
      break;
    case schema::Value::DATA:
      ptr = reinterpret_cast<const word*>(value.getData().begin());
      break;
    case schema::Value::STRUCT:
      ptr = value.getStruct().getAs<_::UncheckedMessage>();
      break;
    case schema::Value::LIST:
      ptr = value.getList().getAs<_::UncheckedMessage>();
      break;
    case schema::Value::ANY_POINTER:
      ptr = value.getAnyPointer().getAs<_::UncheckedMessage>();
      break;
    default:
      KJ_FAIL_ASSERT("getDefaultValueSchemaOffset() can only be called on struct, list, "
                     "and any-pointer fields.");
  }

  return ptr - raw->generic->encodedNode;
}